

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsCompiler.cxx
# Opt level: O1

void __thiscall
cmDependsCompiler::WriteDependencies
          (cmDependsCompiler *this,DependencyMap *dependencies,ostream *makeDepends,
          ostream *internalDepends)

{
  char cVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  _Base_ptr p_Var3;
  char cVar4;
  ostream *poVar5;
  long *plVar6;
  _Base_ptr p_Var7;
  ostream *poVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dep;
  __node_base _Var9;
  _Base_ptr p_Var10;
  bool bVar11;
  string target;
  DependencyMap makeDependencies;
  unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  phonyTargets;
  string local_120;
  _Rb_tree_node_base *local_100;
  _Rb_tree_node_base *local_f8;
  string local_f0;
  ostream *local_d0;
  cmDependsCompiler *local_c8;
  cmGlobalGenerator *local_c0;
  undefined1 local_b8 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_98;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_c0 = (this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
             GlobalGenerator;
  cVar1 = *(char *)((long)&local_c0[1].FindMakeProgramFile._M_string_length + 4);
  local_100 = (_Rb_tree_node_base *)dependencies;
  local_d0 = internalDepends;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::_Rb_tree(&local_98,&dependencies->_M_t);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  cVar4 = (char)makeDepends;
  if ((_Rb_tree_header *)local_98._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_98._M_impl.super__Rb_tree_header) {
    p_Var7 = local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    local_c8 = this;
    do {
      pcVar2 = this->LocalGenerator;
      cmOutputConverter::MaybeRelativeToTopBinDir
                (&local_120,
                 &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,(string *)(p_Var7 + 1));
      cmLocalUnixMakefileGenerator3::ConvertToMakefilePath(&local_f0,pcVar2,&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      p_Var3 = p_Var7[2]._M_parent;
      local_f8 = p_Var7;
      for (p_Var10 = *(_Base_ptr *)(p_Var7 + 2); p_Var10 != p_Var3; p_Var10 = p_Var10 + 1) {
        pcVar2 = this->LocalGenerator;
        cmOutputConverter::MaybeRelativeToTopBinDir
                  (&local_120,
                   &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,(string *)p_Var10);
        cmLocalUnixMakefileGenerator3::ConvertToMakefilePath((string *)local_b8,pcVar2,&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::operator=((string *)p_Var10,(string *)local_b8);
        if ((_Base_ptr)local_b8._0_8_ != (_Base_ptr)(local_b8 + 0x10)) {
          operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
        }
      }
      if (cVar1 != '\0') {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (makeDepends,local_f0._M_dataplus._M_p,local_f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
      }
      p_Var7 = *(_Base_ptr *)(local_f8 + 2);
      p_Var10 = local_f8[2]._M_parent;
      if (p_Var7 != p_Var10) {
        bVar11 = true;
        do {
          if (cVar1 == '\0') {
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (makeDepends,local_f0._M_dataplus._M_p,local_f0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,*(char **)p_Var7,(long)p_Var7->_M_parent);
            std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
          }
          else if (bVar11) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (makeDepends,*(char **)p_Var7,(long)p_Var7->_M_parent);
            bVar11 = false;
          }
          else {
            local_120._M_dataplus._M_p._0_1_ = 0x20;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (makeDepends,(char *)&local_120,1);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(char *)local_c0[1].MakeSilentFlag.field_2.
                                               _M_allocated_capacity,
                                *(long *)((long)&local_c0[1].MakeSilentFlag.field_2 + 8));
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,*(char **)p_Var7,(long)p_Var7->_M_parent);
          }
          local_120._M_dataplus._M_p = *(pointer *)p_Var7;
          local_b8._0_8_ = p_Var7->_M_parent;
          std::
          _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::_M_emplace<char_const*,unsigned_long>
                    ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)&local_68,&local_120,(string *)local_b8);
          p_Var7 = p_Var7 + 1;
        } while (p_Var7 != p_Var10);
      }
      std::ios::widen((char)makeDepends->_vptr_basic_ostream[-3] + cVar4);
      this = local_c8;
      std::ostream::put(cVar4);
      plVar6 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(local_f8);
    } while ((_Rb_tree_header *)p_Var7 != &local_98._M_impl.super__Rb_tree_header);
  }
  if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var9._M_nxt = local_68._M_before_begin._M_nxt;
    do {
      std::ios::widen((char)makeDepends->_vptr_basic_ostream[-3] + cVar4);
      std::ostream::put(cVar4);
      poVar5 = (ostream *)std::ostream::flush();
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)_Var9._M_nxt[2]._M_nxt,(long)_Var9._M_nxt[1]._M_nxt);
      local_120._M_dataplus._M_p._0_1_ = 0x3a;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_120,1);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      _Var9._M_nxt = (_Var9._M_nxt)->_M_nxt;
    } while (_Var9._M_nxt != (_Hash_node_base *)0x0);
  }
  poVar5 = local_d0;
  p_Var7 = (((_Rep_type *)&local_100->_M_color)->_M_impl).super__Rb_tree_header._M_header._M_left;
  local_100 = &(((_Rep_type *)&local_100->_M_color)->_M_impl).super__Rb_tree_header._M_header;
  if (p_Var7 != local_100) {
    do {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,*(char **)(p_Var7 + 1),(long)p_Var7[1]._M_parent);
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      p_Var3 = p_Var7[2]._M_parent;
      for (p_Var10 = *(_Base_ptr *)(p_Var7 + 2); p_Var10 != p_Var3; p_Var10 = p_Var10 + 1) {
        local_120._M_dataplus._M_p._0_1_ = 0x20;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_120,1);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,*(char **)p_Var10,(long)p_Var10->_M_parent);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != local_100);
  }
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_98);
  return;
}

Assistant:

void cmDependsCompiler::WriteDependencies(
  const cmDepends::DependencyMap& dependencies, std::ostream& makeDepends,
  std::ostream& internalDepends)
{
  // dependencies file consumed by make tool
  const auto& lineContinue = static_cast<cmGlobalUnixMakefileGenerator3*>(
                               this->LocalGenerator->GetGlobalGenerator())
                               ->LineContinueDirective;
  bool supportLongLineDepend = static_cast<cmGlobalUnixMakefileGenerator3*>(
                                 this->LocalGenerator->GetGlobalGenerator())
                                 ->SupportsLongLineDependencies();
  cmDepends::DependencyMap makeDependencies(dependencies);
  std::unordered_set<cm::string_view> phonyTargets;

  // external dependencies file
  for (auto& node : makeDependencies) {
    auto target = this->LocalGenerator->ConvertToMakefilePath(
      this->LocalGenerator->MaybeRelativeToTopBinDir(node.first));
    auto& deps = node.second;
    std::transform(deps.cbegin(), deps.cend(), deps.begin(),
                   [this](const std::string& dep) {
                     return this->LocalGenerator->ConvertToMakefilePath(
                       this->LocalGenerator->MaybeRelativeToTopBinDir(dep));
                   });

    bool first_dep = true;
    if (supportLongLineDepend) {
      makeDepends << target << ": ";
    }
    for (const auto& dep : deps) {
      if (supportLongLineDepend) {
        if (first_dep) {
          first_dep = false;
          makeDepends << dep;
        } else {
          makeDepends << ' ' << lineContinue << "  " << dep;
        }
      } else {
        makeDepends << target << ": " << dep << std::endl;
      }

      phonyTargets.emplace(dep.data(), dep.length());
    }
    makeDepends << std::endl << std::endl;
  }

  // add phony targets
  for (const auto& target : phonyTargets) {
    makeDepends << std::endl << target << ':' << std::endl;
  }

  // internal dependencies file
  for (const auto& node : dependencies) {
    internalDepends << node.first << std::endl;
    for (const auto& dep : node.second) {
      internalDepends << ' ' << dep << std::endl;
    }
    internalDepends << std::endl;
  }
}